

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrokeFeaturesTests.cpp
# Opt level: O0

void __thiscall agge::joins::tests::BevelJoinTests::OuterJoinIsBeveled(BevelJoinTests *this)

{
  real_t rVar1;
  real_t rVar2;
  allocator local_1a1;
  string local_1a0 [32];
  LocationInfo local_180;
  point<float> pStack_158;
  point_r reference3 [2];
  string local_140 [32];
  LocationInfo local_120;
  point<float> pStack_f8;
  point_r reference2 [4];
  string local_d0 [32];
  LocationInfo local_b0;
  point<float> pStack_88;
  point_r reference1 [2];
  bevel local_68;
  bevel j;
  points output;
  point_r seq2 [3];
  point_r pStack_28;
  point_r seq1 [3];
  BevelJoinTests *this_local;
  
  seq1[1].x = 17.2;
  seq1[1].y = 3.1;
  pStack_28.x = 3.1;
  pStack_28.y = 3.1;
  seq1[0].x = 7.1;
  seq1[0].y = 2.3;
  seq2[1].x = 3.7;
  seq2[1].y = 16.5;
  output._limit = (point<float> *)0x4046666640466666;
  seq2[0].x = 7.1;
  seq2[0].y = 9.3;
  seq1[2] = (point_r)this;
  pod_vector<agge::point<float>_>::pod_vector((pod_vector<agge::point<float>_> *)&j,0);
  bevel::bevel(&local_68);
  rVar1 = distance(&pStack_28,seq1);
  rVar2 = distance(seq1,seq1 + 1);
  bevel::calc(&local_68,(points *)&j,1.0,&pStack_28,rVar1,seq1,rVar2,seq1 + 1);
  pStack_88.x = 6.90388;
  pStack_88.y = 1.31942;
  reference1[0].x = 7.17896;
  reference1[0].y = 1.30312;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeFeaturesTests.cpp"
             ,(allocator *)((long)&reference2[3].y + 3));
  ut::LocationInfo::LocationInfo(&local_b0,(string *)local_d0,0x2a);
  ut::are_equal<agge::point<float>,2ul,agge::pod_vector<agge::point<float>>>
            ((point<float> (*) [2])&pStack_88,(pod_vector<agge::point<float>_> *)&j,&local_b0);
  ut::LocationInfo::~LocationInfo(&local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&reference2[3].y + 3));
  rVar1 = distance(&pStack_28,seq1);
  rVar2 = distance(seq1,seq1 + 1);
  bevel::calc(&local_68,(points *)&j,1.75,&pStack_28,rVar1,seq1,rVar2,seq1 + 1);
  reference2[1].x = 6.7568;
  reference2[1].y = 0.583984;
  reference2[2].x = 7.23818;
  reference2[2].y = 0.555464;
  pStack_f8.x = 6.90388;
  pStack_f8.y = 1.31942;
  reference2[0].x = 7.17896;
  reference2[0].y = 1.30312;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_140,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeFeaturesTests.cpp"
             ,(allocator *)((long)&reference3[1].y + 3));
  ut::LocationInfo::LocationInfo(&local_120,(string *)local_140,0x37);
  ut::are_equal<agge::point<float>,4ul,agge::pod_vector<agge::point<float>>>
            ((point<float> (*) [4])&pStack_f8,(pod_vector<agge::point<float>_> *)&j,&local_120);
  ut::LocationInfo::~LocationInfo(&local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&reference3[1].y + 3));
  pod_vector<agge::point<float>_>::clear((pod_vector<agge::point<float>_> *)&j);
  rVar1 = distance((point_r *)&output._limit,seq2);
  rVar2 = distance(seq2,seq2 + 1);
  bevel::calc(&local_68,(points *)&j,1.75,(point_r *)&output._limit,rVar1,seq2,rVar2,seq2 + 1);
  pStack_158.x = 8.57052;
  pStack_158.y = 8.35128;
  reference3[0].x = 8.68244;
  reference3[0].y = 10.0473;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeFeaturesTests.cpp"
             ,&local_1a1);
  ut::LocationInfo::LocationInfo(&local_180,(string *)local_1a0,0x45);
  ut::are_equal<agge::point<float>,2ul,agge::pod_vector<agge::point<float>>>
            ((point<float> (*) [2])&pStack_158,(pod_vector<agge::point<float>_> *)&j,&local_180);
  ut::LocationInfo::~LocationInfo(&local_180);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  bevel::~bevel(&local_68);
  pod_vector<agge::point<float>_>::~pod_vector((pod_vector<agge::point<float>_> *)&j);
  return;
}

Assistant:

test( OuterJoinIsBeveled )
				{
					// INIT
					const point_r seq1[] = {
						{ 3.1f, 3.1f },
						{ 7.1f, 2.3f },
						{ 17.2f, 3.1f },
					};
					const point_r seq2[] = {
						{ 3.1f, 3.1f },
						{ 7.1f, 9.3f },
						{ 3.7f, 16.5f },
					};
					points output;
					bevel j;

					// ACT
					j.calc(output, 1.0f, seq1[0], distance(seq1[0], seq1[1]), seq1[1], distance(seq1[1], seq1[2]), seq1[2]);

					// ASSERT
					point_r reference1[] = {
						{ 6.90388f, 1.31942f },
						{ 7.17896f, 1.30312f },
					};

					assert_equal(reference1, output);

					// ACT
					j.calc(output, 1.75f, seq1[0], distance(seq1[0], seq1[1]), seq1[1], distance(seq1[1], seq1[2]), seq1[2]);

					// ASSERT
					point_r reference2[] = {
						{ 6.90388f, 1.31942f },
						{ 7.17896f, 1.30312f },
						{ 6.75680f, 0.583984f },
						{ 7.23818f, 0.555464f },
					};

					assert_equal(reference2, output);

					// INIT
					output.clear();

					// ACT
					j.calc(output, 1.75f, seq2[0], distance(seq2[0], seq2[1]), seq2[1], distance(seq2[1], seq2[2]), seq2[2]);

					// ASSERT
					point_r reference3[] = {
						{ 8.57052f, 8.35128f },
						{ 8.68244f, 10.0473f },
					};

					assert_equal(reference3, output);
				}